

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slater_exchange.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinSlaterExchange>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double t40;
  double t39;
  double t35;
  double t31;
  double t30;
  double t29;
  double t27;
  double t26;
  double t25;
  double t24;
  double t20;
  double t19;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t8;
  double t7;
  double t6;
  double t1;
  double t5;
  double t13;
  double t3;
  double t2;
  
  dVar1 = 1.0 / (in_XMM0_Qa + in_XMM1_Qa);
  dVar2 = safe_math::cbrt<double>(9.35408558483482e-318);
  dVar3 = safe_math::cbrt<double>(9.35448577800795e-318);
  dVar3 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(in_XMM0_Qa * dVar1 + in_XMM0_Qa * dVar1 <= 1e-15) &
                                      0x3ff0000000000000) != 0.0) & 1),dVar2 * 1e-15,
                     (in_XMM0_Qa * 1.2599210498948732 + in_XMM0_Qa * 1.2599210498948732) * dVar1 *
                     dVar3);
  dVar4 = safe_math::cbrt<double>(9.35506877547004e-318);
  dVar3 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(in_XMM0_Qa <= 1e-24) & 0x3ff0000000000000) != 0.0) &
                           1),0.0,dVar3 * -0.36927938319101117 * dVar4);
  dVar5 = safe_math::cbrt<double>(9.35623477039423e-318);
  dVar1 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM1_Qa * dVar1 + in_XMM1_Qa * dVar1 <= 1e-15) &
                             0x3ff0000000000000) != 0.0,dVar2 * 1e-15,
                     in_XMM1_Qa * 1.2599210498948732 * 2.0 * dVar1 * dVar5);
  dVar1 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM1_Qa <= 1e-24) & 0x3ff0000000000000) != 0.0,0.0,
                     dVar1 * -0.36927938319101117 * dVar4);
  *in_RDI = dVar3 + dVar1 * 1.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_pi;
    constexpr double t13 = constants::m_cbrt_2;
    constexpr double t5 = t2 / t3;


    const double t1 = rho_a <= dens_tol;
    const double t6 = rho_a + rho_b;
    const double t7 = 0.1e1 / t6;
    const double t8 = rho_a * t7;
    const double t10 = 0.2e1 * t8 <= zeta_tol;
    const double t11 = safe_math::cbrt( zeta_tol );
    const double t12 = t11 * zeta_tol;
    const double t14 = t13 * rho_a;
    const double t15 = safe_math::cbrt( t8 );
    const double t19 = piecewise_functor_3( t10, t12, 0.2e1 * t14 * t7 * t15 );
    const double t20 = safe_math::cbrt( t6 );
    const double t24 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t19 * t20 );
    const double t25 = alpha * t24;
    const double t26 = rho_b <= dens_tol;
    const double t27 = rho_b * t7;
    const double t29 = 0.2e1 * t27 <= zeta_tol;
    const double t30 = t13 * rho_b;
    const double t31 = safe_math::cbrt( t27 );
    const double t35 = piecewise_functor_3( t29, t12, 0.2e1 * t30 * t7 * t31 );
    const double t39 = piecewise_functor_3( t26, 0.0, -0.3e1 / 0.8e1 * t5 * t35 * t20 );
    const double t40 = alpha * t39;


    eps = t25 + t40;

  }